

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void do_cmd_prev_stats(command *cmd)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  player *ppVar3;
  
  if (prev.age != 0) {
    load_roller_data(&prev,&prev);
    ppVar3 = player;
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 5;
    update_stuff(ppVar3);
    ppVar3 = player;
    piVar2 = &player->msp;
    player->chp = player->mhp;
    ppVar3->csp = *piVar2;
  }
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  return;
}

Assistant:

void do_cmd_prev_stats(struct command *cmd)
{
	/* Only switch to the stored "previous"
	   character if we've actually got one to load. */
	if (prev.age) {
		load_roller_data(&prev, &prev);
		get_bonuses();
	}

	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);	
}